

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-summon.c
# Opt level: O0

void cleanup_summon(void)

{
  monster_base_list *pmVar1;
  monster_base_list *next;
  monster_base_list *s;
  wchar_t idx;
  
  for (s._4_4_ = L'\0'; s._4_4_ < summon_max; s._4_4_ = s._4_4_ + L'\x01') {
    next = summons[s._4_4_].bases;
    while (next != (monster_base_list *)0x0) {
      pmVar1 = next->next;
      mem_free(next);
      next = pmVar1;
    }
    string_free(summons[s._4_4_].desc);
    string_free(summons[s._4_4_].fallback_name);
    string_free(summons[s._4_4_].name);
  }
  mem_free(summons);
  return;
}

Assistant:

static void cleanup_summon(void)
{
	int idx;
	for (idx = 0; idx < summon_max; idx++) {
		struct monster_base_list *s = summons[idx].bases;
		while (s) {
			struct monster_base_list *next = s->next;
			mem_free(s);
			s = next;
		}
		string_free(summons[idx].desc);
		string_free(summons[idx].fallback_name);
		string_free(summons[idx].name);
	}
	mem_free(summons);
}